

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::DistantLight>::transform
          (LightNodeImpl<embree::SceneGraph::DistantLight> *this,AffineSpace3fa *space)

{
  LightNodeImpl<embree::SceneGraph::DistantLight> *this_00;
  AffineSpace3fa *in_RDX;
  DistantLight DStack_68;
  
  this_00 = (LightNodeImpl<embree::SceneGraph::DistantLight> *)operator_new(0xb0);
  DistantLight::transform(&DStack_68,(DistantLight *)&space[1].p,in_RDX);
  LightNodeImpl(this_00,&DStack_68);
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_LightNode).super_Node.super_RefCount._vptr_RefCount[2])(this_00);
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> transform(const AffineSpace3fa& space) const {
        return new LightNodeImpl(light.transform(space));
      }